

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

int AlphaVectorPruning::GetVectorIndex
              (AlphaVector *p,ValueFunctionPOMDPDiscrete *uU,
              vector<double,_std::allocator<double>_> *belief)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Index j;
  double currentVal;
  AlphaVector curr;
  Index i;
  size_t nrStates;
  Index currentIndex;
  double currentMin;
  undefined4 in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff4c;
  AlphaVector *in_stack_ffffffffffffff50;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_34;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = std::numeric_limits<double>::infinity();
  local_24 = 0;
  uVar1 = AlphaVector::GetNrValues((AlphaVector *)0x91d985);
  local_34 = 0;
  while( true ) {
    sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
    if (sVar2 <= local_34) break;
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_ffffffffffffff50,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    AlphaVector::AlphaVector
              (in_stack_ffffffffffffff50,
               (AlphaVector *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_68 = 0.0;
    for (local_6c = 0; local_6c < uVar1; local_6c = local_6c + 1) {
      dVar4 = AlphaVector::GetValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar5 = AlphaVector::GetValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_stack_ffffffffffffff50 = (AlphaVector *)(dVar4 - dVar5);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = in_stack_ffffffffffffff50;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_68;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *pvVar3;
      auVar6 = vfmadd213sd_fma(auVar6,auVar7,auVar8);
      local_68 = auVar6._0_8_;
    }
    if (local_68 < local_20) {
      local_20 = local_68;
      local_24 = local_34;
    }
    AlphaVector::~AlphaVector((AlphaVector *)0x91dafc);
    local_34 = local_34 + 1;
  }
  return local_24;
}

Assistant:

int AlphaVectorPruning::GetVectorIndex(const AlphaVector &p,
                                    const ValueFunctionPOMDPDiscrete &uU,
                                    vector<double> &belief)
{
    double currentMin = std::numeric_limits<double>::infinity();
    Index currentIndex = 0;
    size_t nrStates = p.GetNrValues();

    for(Index i=0; i<uU.size();i++)
    {
        AlphaVector curr = uU.at(i);
        double currentVal = 0.0;

        for(Index j=0; j<nrStates; j++)
        {
            currentVal = currentVal + (p.GetValue(j)-curr.GetValue(j)) * belief.at(j);
        }

        if(currentVal < currentMin) 
        {
            currentMin = currentVal;
            currentIndex = i;
        }
    }

    return currentIndex;
}